

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error SW_FT_Outline_Check(SW_FT_Outline *outline)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SW_FT_Int n;
  SW_FT_Int end;
  SW_FT_Int end0;
  SW_FT_Int n_contours;
  SW_FT_Int n_points;
  SW_FT_Outline *outline_local;
  
  if (outline != (SW_FT_Outline *)0x0) {
    iVar1 = (int)outline->n_points;
    iVar2 = (int)outline->n_contours;
    if ((iVar1 == 0) && (iVar2 == 0)) {
      return 0;
    }
    if ((0 < iVar1) && (0 < iVar2)) {
      end0 = -1;
      for (n = 0; n < iVar2; n = n + 1) {
        iVar3 = (int)outline->contours[n];
        if (iVar3 <= end0) {
          return -1;
        }
        if (iVar1 <= iVar3) {
          return -1;
        }
        end0 = iVar3;
      }
      if (end0 == iVar1 + -1) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

SW_FT_Error SW_FT_Outline_Check(SW_FT_Outline* outline)
{
    if (outline) {
        SW_FT_Int n_points = outline->n_points;
        SW_FT_Int n_contours = outline->n_contours;
        SW_FT_Int end0, end;
        SW_FT_Int n;

        /* empty glyph? */
        if (n_points == 0 && n_contours == 0) return 0;

        /* check point and contour counts */
        if (n_points <= 0 || n_contours <= 0) goto Bad;

        end0 = end = -1;
        for (n = 0; n < n_contours; n++) {
            end = outline->contours[n];

            /* note that we don't accept empty contours */
            if (end <= end0 || end >= n_points) goto Bad;

            end0 = end;
        }

        if (end != n_points - 1) goto Bad;

        /* XXX: check the tags array */
        return 0;
    }

Bad:
    return -1;  // SW_FT_THROW( Invalid_Argument );
}